

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.h
# Opt level: O0

void __thiscall Assimp::LWS::NodeDesc::NodeDesc(NodeDesc *this)

{
  NodeDesc *this_local;
  
  this->type = 0;
  std::__cxx11::string::string((string *)&this->path);
  this->id = 0;
  this->number = 0;
  this->parent = 0;
  this->name = "";
  std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::list
            (&this->channels);
  aiVector3t<float>::aiVector3t(&this->pivotPos);
  this->isPivotSet = false;
  aiColor3D::aiColor3D(&this->lightColor,1.0,1.0,1.0);
  this->lightIntensity = 1.0;
  this->lightType = 0;
  this->lightFalloffType = 0;
  this->lightConeAngle = 45.0;
  this->lightEdgeAngle = 0.0;
  std::__cxx11::list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>::list
            (&this->children);
  this->parent_resolved = (NodeDesc *)0x0;
  return;
}

Assistant:

NodeDesc()
        :   type()
        ,   id()
        ,   number  (0)
        ,   parent  (0)
        ,   name    ("")
        ,   isPivotSet (false)
        ,   lightColor (1.f,1.f,1.f)
        ,   lightIntensity (1.f)
        ,   lightType (0)
        ,   lightFalloffType (0)
        ,   lightConeAngle (45.f)
        ,   lightEdgeAngle()
        ,   parent_resolved (NULL)
    {}